

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void iq3xs_init_impl(int grid_size)

{
  uint16_t uVar1;
  int *__ptr;
  long lVar2;
  int in_EDI;
  int j_3;
  int nhave_1;
  int n_1;
  uint16_t *start;
  int d2_2;
  int k_5;
  int d2_3;
  int8_t *pg_1;
  int j_2;
  int l_2;
  int k_4;
  int i_4;
  int counter;
  int j_1;
  int nhave;
  int d2;
  int n;
  int k_3;
  int d2_1;
  int8_t *pg;
  int j;
  int l_1;
  int k_2;
  int i_3;
  int num_not_in_map;
  int num_neighbors;
  int *dist2;
  int8_t pos [4];
  uint16_t q;
  int k_1;
  uint16_t index;
  int i_2;
  uint8_t *aux8;
  uint32_t aux32;
  int i_1;
  int l;
  int i;
  int8_t *pos_1;
  int k;
  uint32_t *the_grid;
  uint16_t *kneighbors_q3xs;
  int *kmap_q3xs;
  uint32_t *kgrid_q3xs;
  uint16_t *kgrid;
  int nwant;
  int kmap_size;
  int gindex;
  int local_fc;
  int local_f8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_cc;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  char acStack_72 [4];
  short local_6e;
  int local_6c;
  ushort local_66;
  int local_64;
  uint32_t *local_60;
  uint32_t local_58 [2];
  uint local_50;
  int local_4c;
  uint32_t *local_48;
  int local_3c;
  uint32_t *local_38;
  uint16_t *local_30;
  int *local_28;
  uint32_t *local_20;
  uint16_t *local_18;
  int local_10;
  undefined4 local_c;
  int local_8;
  int local_4;
  
  local_4 = in_EDI;
  local_8 = iq3_data_index(0);
  if (iq3_data[local_8].grid == (uint32_t *)0x0) {
    local_c = 0x1000;
    local_10 = 3;
    if (local_4 == 0x100) {
      local_10 = 2;
    }
    local_18 = iq3xs_init_impl::kgrid_512;
    if (local_4 == 0x100) {
      local_18 = iq3xs_init_impl::kgrid_256;
    }
    local_38 = (uint32_t *)malloc((long)local_4 << 2);
    for (local_3c = 0; local_3c < local_4; local_3c = local_3c + 1) {
      local_48 = local_38 + local_3c;
      for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
        local_50 = (int)(uint)local_18[local_3c] >> ((char)local_4c * '\x03' & 0x1fU) & 7;
        *(char *)((long)local_48 + (long)local_4c) = (char)(local_50 << 1) + '\x01';
      }
    }
    iq3_data[local_8].grid = local_38;
    local_20 = local_38;
    local_28 = (int *)malloc(0x4000);
    iq3_data[local_8].map = local_28;
    for (local_58[1] = 0; (int)local_58[1] < 0x1000; local_58[1] = local_58[1] + 1) {
      local_28[(int)local_58[1]] = -1;
    }
    local_60 = local_58;
    for (local_64 = 0; local_64 < local_4; local_64 = local_64 + 1) {
      local_58[0] = local_20[local_64];
      local_66 = 0;
      for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
        local_6e = (short)((int)(*(byte *)((long)local_60 + (long)local_6c) - 1) / 2);
        local_66 = local_66 | local_6e << ((char)local_6c * '\x03' & 0x1fU);
      }
      local_28[local_66] = local_64;
    }
    __ptr = (int *)malloc((long)(local_4 << 1) << 2);
    local_84 = 0;
    local_88 = 0;
    for (local_8c = 0; local_8c < 0x1000; local_8c = local_8c + 1) {
      if (local_28[local_8c] < 0) {
        local_88 = local_88 + 1;
        for (local_90 = 0; local_90 < 4; local_90 = local_90 + 1) {
          acStack_72[local_90] =
               (char)((local_8c >> ((char)local_90 * '\x03' & 0x1fU) & 7U) << 1) + '\x01';
        }
        for (local_98 = 0; local_98 < local_4; local_98 = local_98 + 1) {
          local_a4 = 0;
          for (local_a8 = 0; local_a8 < 4; local_a8 = local_a8 + 1) {
            local_a4 = ((int)*(char *)((long)local_20 + (long)local_a8 + (long)local_98 * 4) -
                       (int)acStack_72[local_a8]) *
                       ((int)*(char *)((long)local_20 + (long)local_a8 + (long)local_98 * 4) -
                       (int)acStack_72[local_a8]) + local_a4;
          }
          __ptr[local_98 << 1] = local_a4;
          __ptr[local_98 * 2 + 1] = local_98;
        }
        qsort(__ptr,(long)local_4,8,iq3_compare_func);
        local_ac = 0;
        local_b0 = *__ptr;
        local_b4 = 1;
        for (local_b8 = 0; local_b8 < local_4; local_b8 = local_b8 + 1) {
          if (local_b0 < __ptr[local_b8 << 1]) {
            if (local_b4 == local_10) break;
            local_b0 = __ptr[local_b8 << 1];
            local_b4 = local_b4 + 1;
          }
          local_ac = local_ac + 1;
        }
        local_84 = local_ac + local_84;
      }
    }
    local_30 = (uint16_t *)malloc((long)(local_84 + local_88) << 1);
    iq3_data[local_8].neighbours = local_30;
    local_bc = 0;
    for (local_c0 = 0; local_c0 < 0x1000; local_c0 = local_c0 + 1) {
      if (local_28[local_c0] < 0) {
        for (local_c4 = 0; local_c4 < 4; local_c4 = local_c4 + 1) {
          acStack_72[local_c4] =
               (char)((local_c0 >> ((char)local_c4 * '\x03' & 0x1fU) & 7U) << 1) + '\x01';
        }
        for (local_cc = 0; local_cc < local_4; local_cc = local_cc + 1) {
          local_dc = 0;
          for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
            local_dc = ((int)*(char *)((long)local_20 + (long)local_e0 + (long)local_cc * 4) -
                       (int)acStack_72[local_e0]) *
                       ((int)*(char *)((long)local_20 + (long)local_e0 + (long)local_cc * 4) -
                       (int)acStack_72[local_e0]) + local_dc;
          }
          __ptr[local_cc << 1] = local_dc;
          __ptr[local_cc * 2 + 1] = local_cc;
        }
        qsort(__ptr,(long)local_4,8,iq3_compare_func);
        local_28[local_c0] = -(local_bc + 1);
        local_e4 = *__ptr;
        lVar2 = (long)local_bc;
        uVar1 = 0;
        local_f8 = 1;
        for (local_fc = 0; local_bc = local_bc + 1, local_fc < local_4; local_fc = local_fc + 1) {
          if (local_e4 < __ptr[local_fc << 1]) {
            if (local_f8 == local_10) break;
            local_e4 = __ptr[local_fc << 1];
            local_f8 = local_f8 + 1;
          }
          local_30[local_bc] = (uint16_t)__ptr[local_fc * 2 + 1];
          uVar1 = uVar1 + 1;
        }
        local_30[lVar2] = uVar1;
      }
    }
    free(__ptr);
  }
  return;
}

Assistant:

void iq3xs_init_impl(int grid_size) {
    const int gindex = iq3_data_index(grid_size);
    if (iq3_data[gindex].grid) {
        return;
    }
    static const uint16_t kgrid_256[256] = {
            0,     2,     4,     9,    11,    15,    16,    18,    25,    34,    59,    61,    65,    67,    72,    74,
           81,    85,    88,    90,    97,   108,   120,   128,   130,   132,   137,   144,   146,   153,   155,   159,
          169,   175,   189,   193,   199,   200,   202,   213,   248,   267,   287,   292,   303,   315,   317,   321,
          327,   346,   362,   413,   436,   456,   460,   462,   483,   497,   513,   515,   520,   522,   529,   531,
          536,   538,   540,   551,   552,   576,   578,   585,   592,   594,   641,   643,   648,   650,   657,   664,
          698,   704,   706,   720,   729,   742,   758,   769,   773,   808,   848,   852,   870,   889,   901,   978,
          992,  1024,  1026,  1033,  1035,  1040,  1042,  1046,  1049,  1058,  1089,  1091,  1093,  1096,  1098,  1105,
         1112,  1139,  1143,  1144,  1152,  1154,  1161,  1167,  1168,  1170,  1183,  1184,  1197,  1217,  1224,  1228,
         1272,  1276,  1309,  1323,  1347,  1367,  1377,  1404,  1473,  1475,  1486,  1509,  1537,  1544,  1546,  1553,
         1555,  1576,  1589,  1594,  1600,  1602,  1616,  1625,  1636,  1638,  1665,  1667,  1672,  1685,  1706,  1722,
         1737,  1755,  1816,  1831,  1850,  1856,  1862,  1874,  1901,  1932,  1950,  1971,  2011,  2032,  2052,  2063,
         2077,  2079,  2091,  2095,  2172,  2192,  2207,  2208,  2224,  2230,  2247,  2277,  2308,  2345,  2356,  2389,
         2403,  2424,  2501,  2504,  2506,  2520,  2570,  2593,  2616,  2624,  2630,  2646,  2669,  2700,  2714,  2746,
         2754,  2795,  2824,  2835,  2839,  2874,  2882,  2905,  2984,  3028,  3042,  3092,  3108,  3110,  3124,  3153,
         3185,  3215,  3252,  3288,  3294,  3364,  3397,  3434,  3483,  3523,  3537,  3587,  3589,  3591,  3592,  3610,
         3626,  3670,  3680,  3722,  3749,  3754,  3776,  3789,  3803,  3824,  3857,  3873,  3904,  3906,  3924,  3992,
    };
    static const uint16_t kgrid_512[512] = {
            0,     1,     2,     5,     7,     8,     9,    10,    12,    14,    16,    17,    21,    27,    32,    34,
           37,    39,    41,    43,    48,    50,    57,    60,    63,    64,    65,    66,    68,    72,    73,    77,
           80,    83,    87,    89,    93,   100,   113,   117,   122,   128,   129,   133,   135,   136,   139,   142,
          145,   149,   152,   156,   162,   165,   167,   169,   171,   184,   187,   195,   201,   205,   208,   210,
          217,   219,   222,   228,   232,   234,   247,   249,   253,   256,   267,   271,   273,   276,   282,   288,
          291,   297,   312,   322,   324,   336,   338,   342,   347,   353,   357,   359,   374,   379,   390,   393,
          395,   409,   426,   441,   448,   450,   452,   464,   466,   470,   475,   488,   492,   512,   513,   514,
          516,   520,   521,   523,   525,   527,   528,   530,   537,   540,   542,   556,   558,   561,   570,   576,
          577,   579,   582,   584,   588,   593,   600,   603,   609,   616,   618,   632,   638,   640,   650,   653,
          655,   656,   660,   666,   672,   675,   685,   688,   698,   705,   708,   711,   712,   715,   721,   727,
          728,   732,   737,   754,   760,   771,   773,   778,   780,   793,   795,   802,   806,   808,   812,   833,
          840,   843,   849,   856,   858,   873,   912,   916,   919,   932,   934,   961,   963,   968,   970,   977,
          989,   993,  1010,  1016,  1024,  1025,  1027,  1029,  1031,  1032,  1034,  1036,  1038,  1041,  1043,  1047,
         1048,  1050,  1057,  1059,  1061,  1064,  1066,  1079,  1080,  1083,  1085,  1088,  1090,  1096,  1099,  1103,
         1106,  1109,  1113,  1116,  1122,  1129,  1153,  1156,  1159,  1169,  1171,  1176,  1183,  1185,  1195,  1199,
         1209,  1212,  1216,  1218,  1221,  1225,  1234,  1236,  1241,  1243,  1250,  1256,  1270,  1281,  1287,  1296,
         1299,  1306,  1309,  1313,  1338,  1341,  1348,  1353,  1362,  1375,  1376,  1387,  1400,  1408,  1410,  1415,
         1425,  1453,  1457,  1477,  1481,  1494,  1496,  1507,  1512,  1538,  1545,  1547,  1549,  1551,  1554,  1561,
         1563,  1565,  1570,  1572,  1575,  1577,  1587,  1593,  1601,  1603,  1605,  1612,  1617,  1619,  1632,  1648,
         1658,  1662,  1664,  1674,  1680,  1690,  1692,  1704,  1729,  1736,  1740,  1745,  1747,  1751,  1752,  1761,
         1763,  1767,  1773,  1787,  1795,  1801,  1806,  1810,  1817,  1834,  1840,  1844,  1857,  1864,  1866,  1877,
         1882,  1892,  1902,  1915,  1934,  1953,  1985,  1987,  2000,  2002,  2013,  2048,  2052,  2058,  2064,  2068,
         2071,  2074,  2081,  2088,  2104,  2114,  2119,  2121,  2123,  2130,  2136,  2141,  2147,  2153,  2157,  2177,
         2179,  2184,  2189,  2193,  2203,  2208,  2223,  2226,  2232,  2244,  2249,  2251,  2256,  2258,  2265,  2269,
         2304,  2306,  2324,  2335,  2336,  2361,  2373,  2375,  2385,  2418,  2443,  2460,  2480,  2504,  2509,  2520,
         2531,  2537,  2562,  2568,  2572,  2578,  2592,  2596,  2599,  2602,  2614,  2620,  2625,  2627,  2629,  2634,
         2641,  2650,  2682,  2688,  2697,  2707,  2712,  2718,  2731,  2754,  2759,  2760,  2775,  2788,  2793,  2805,
         2811,  2817,  2820,  2832,  2842,  2854,  2890,  2902,  2921,  2923,  2978,  3010,  3012,  3026,  3081,  3083,
         3085,  3097,  3099,  3120,  3136,  3152,  3159,  3188,  3210,  3228,  3234,  3245,  3250,  3256,  3264,  3276,
         3281,  3296,  3349,  3363,  3378,  3392,  3395,  3420,  3440,  3461,  3488,  3529,  3531,  3584,  3588,  3591,
         3600,  3602,  3614,  3616,  3628,  3634,  3650,  3657,  3668,  3683,  3685,  3713,  3716,  3720,  3726,  3729,
         3736,  3753,  3778,  3802,  3805,  3819,  3841,  3845,  3851,  3856,  3880,  3922,  3938,  3970,  3993,  4032,
    };

    const int kmap_size = 4096;
    const int nwant = grid_size == 256 ? 2 : 3;
    const uint16_t * kgrid = grid_size == 256 ? kgrid_256 : kgrid_512;
    uint32_t * kgrid_q3xs;
    int      * kmap_q3xs;
    uint16_t * kneighbors_q3xs;

    //printf("================================================================= %s(grid_size = %d)\n", __func__, grid_size);
    uint32_t * the_grid = (uint32_t *)malloc(grid_size*sizeof(uint32_t));
    for (int k = 0; k < grid_size; ++k) {
        int8_t * pos = (int8_t *)(the_grid + k);
        for (int i = 0; i < 4; ++i) {
            int l = (kgrid[k] >> 3*i) & 0x7;
            pos[i] = 2*l + 1;
        }
    }
    kgrid_q3xs = the_grid;
    iq3_data[gindex].grid = the_grid;
    kmap_q3xs = (int *)malloc(kmap_size*sizeof(int));
    iq3_data[gindex].map = kmap_q3xs;
    for (int i = 0; i < kmap_size; ++i) kmap_q3xs[i] = -1;
    uint32_t aux32;
    uint8_t * aux8 = (uint8_t *)&aux32;
    for (int i = 0; i < grid_size; ++i) {
        aux32 = kgrid_q3xs[i];
        uint16_t index = 0;
        for (int k=0; k<4; ++k) {
            uint16_t q = (aux8[k] - 1)/2;
            index |= (q << 3*k);
        }
        kmap_q3xs[index] = i;
    }
    int8_t pos[4];
    int * dist2 = (int *)malloc(2*grid_size*sizeof(int));
    int num_neighbors = 0, num_not_in_map = 0;
    for (int i = 0; i < kmap_size; ++i) {
        if (kmap_q3xs[i] >= 0) continue;
        ++num_not_in_map;
        for (int k = 0; k < 4; ++k) {
            int l = (i >> 3*k) & 0x7;
            pos[k] = 2*l + 1;
        }
        for (int j = 0; j < grid_size; ++j) {
            const int8_t * pg = (const int8_t *)(kgrid_q3xs + j);
            int d2 = 0;
            for (int k = 0; k < 4; ++k) d2 += (pg[k] - pos[k])*(pg[k] - pos[k]);
            dist2[2*j+0] = d2;
            dist2[2*j+1] = j;
        }
        qsort(dist2, grid_size, 2*sizeof(int), iq3_compare_func);
        int n = 0; int d2 = dist2[0];
        int nhave = 1;
        for (int j = 0; j < grid_size; ++j) {
            if (dist2[2*j] > d2) {
                if (nhave == nwant) break;
                d2 = dist2[2*j];
                ++nhave;
            }
            ++n;
        }
        num_neighbors += n;
    }
    //printf("%s: %d neighbours in total\n", __func__, num_neighbors);
    kneighbors_q3xs = (uint16_t *)malloc((num_neighbors + num_not_in_map)*sizeof(uint16_t));
    iq3_data[gindex].neighbours = kneighbors_q3xs;
    int counter = 0;
    for (int i = 0; i < kmap_size; ++i) {
        if (kmap_q3xs[i] >= 0) continue;
        for (int k = 0; k < 4; ++k) {
            int l = (i >> 3*k) & 0x7;
            pos[k] = 2*l + 1;
        }
        for (int j = 0; j < grid_size; ++j) {
            const int8_t * pg = (const int8_t *)(kgrid_q3xs + j);
            int d2 = 0;
            for (int k = 0; k < 4; ++k) d2 += (pg[k] - pos[k])*(pg[k] - pos[k]);
            dist2[2*j+0] = d2;
            dist2[2*j+1] = j;
        }
        qsort(dist2, grid_size, 2*sizeof(int), iq3_compare_func);
        kmap_q3xs[i] = -(counter + 1);
        int d2 = dist2[0];
        uint16_t * start = &kneighbors_q3xs[counter++];
        int n = 0, nhave = 1;
        for (int j = 0; j < grid_size; ++j) {
            if (dist2[2*j] > d2) {
                if (nhave == nwant) break;
                d2 = dist2[2*j];
                ++nhave;
            }
            kneighbors_q3xs[counter++] = dist2[2*j+1];
            ++n;
        }
        *start = n;
    }
    free(dist2);
}